

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

void __thiscall
xLearn::Loss::Predict
          (Loss *this,DMatrix *matrix,Model *model,vector<float,_std::allocator<float>_> *pred)

{
  pointer pfVar1;
  pointer pfVar2;
  ThreadPool *pTVar3;
  size_t gap;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Logger local_ac;
  DMatrix *local_a8;
  string local_a0;
  undefined1 local_80 [8];
  ulong local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  Score *local_60;
  vector<float,_std::allocator<float>_> *local_58;
  Model *local_50;
  DMatrix *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_a8 = matrix;
  if (matrix == (DMatrix *)0x0) {
    local_80 = (undefined1  [8])&local_70;
    local_ac.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/loss.cc"
               ,"");
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Predict","");
    poVar5 = Logger::Start(ERR,(string *)local_80,0x36,&local_a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/loss.cc"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x36);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"matrix",6);
    std::operator<<(poVar5," == NULL \n");
  }
  else {
    pfVar1 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pfVar1 == pfVar2) {
      local_80 = (undefined1  [8])&local_70;
      local_ac.severity_ = ERR;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/loss.cc"
                 ,"");
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Predict","");
      poVar5 = Logger::Start(ERR,(string *)local_80,0x37,&local_a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"CHECK_NE failed ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/loss.cc"
                 ,0x5a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x37);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"pred.empty()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"true",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
      std::operator<<(poVar5,"\n");
    }
    else {
      uVar7 = (long)pfVar2 - (long)pfVar1 >> 2;
      if (uVar7 == matrix->row_length) {
        uVar6 = this->threadNumber_;
        if (uVar6 == 0) {
          uVar6 = 0;
        }
        else {
          uVar8 = 0;
          do {
            local_70._M_allocated_capacity = (uVar7 / uVar6) * uVar8;
            uVar9 = uVar8 + 1;
            uVar4 = (uVar7 / uVar6) * uVar9;
            local_78 = uVar7 % uVar6 + uVar4;
            if (uVar8 != uVar6 - 1) {
              local_78 = uVar4;
            }
            local_80 = (undefined1  [8])pred_thread;
            local_70._M_local_buf[8] = this->norm_;
            local_60 = this->score_func_;
            local_48 = local_a8;
            local_58 = pred;
            local_50 = model;
            ThreadPool::
            enqueue<std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,std::vector<float,std::allocator<float>>*,xLearn::Score*,bool,unsigned_long,unsigned_long))(xLearn::DMatrix_const*,xLearn::Model*,std::vector<float,std::allocator<float>>*,xLearn::Score*,bool,unsigned_long,unsigned_long)>>
                      ((ThreadPool *)&stack0xffffffffffffffc0,
                       (_Bind<void_(*(const_xLearn::DMatrix_*,_xLearn::Model_*,_std::vector<float,_std::allocator<float>_>_*,_xLearn::Score_*,_bool,_unsigned_long,_unsigned_long))(const_xLearn::DMatrix_*,_xLearn::Model_*,_std::vector<float,_std::allocator<float>_>_*,_xLearn::Score_*,_bool,_unsigned_long,_unsigned_long)>
                        *)this->pool_);
            if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
            }
            uVar6 = this->threadNumber_;
            uVar8 = uVar9;
          } while (uVar9 < uVar6);
        }
        pTVar3 = this->pool_;
        local_80 = (undefined1  [8])&pTVar3->sync_mutex;
        local_78 = local_78 & 0xffffffffffffff00;
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_80);
        local_78 = CONCAT71(local_78._1_7_,true);
        if ((pTVar3->sync).super___atomic_base<int>._M_i != (int)uVar6) {
          do {
            std::condition_variable::wait((unique_lock *)&pTVar3->sync_condition);
          } while ((pTVar3->sync).super___atomic_base<int>._M_i != (int)uVar6);
        }
        LOCK();
        (pTVar3->sync).super___atomic_base<int>._M_i = 0;
        UNLOCK();
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_80);
        return;
      }
      local_80 = (undefined1  [8])&local_70;
      local_ac.severity_ = ERR;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/loss.cc"
                 ,"");
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Predict","");
      poVar5 = Logger::Start(ERR,(string *)local_80,0x38,&local_a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"CHECK_EQ failed ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/loss.cc"
                 ,0x5a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"pred.size()",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"matrix->row_length",0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"\n");
    }
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)local_80);
  Logger::~Logger(&local_ac);
  abort();
}

Assistant:

void Loss::Predict(const DMatrix* matrix,
                   Model& model,
                   std::vector<real_t>& pred) {
  CHECK_NOTNULL(matrix);
  CHECK_NE(pred.empty(), true);
  CHECK_EQ(pred.size(), matrix->row_length);
  index_t row_len = matrix->row_length;
  // Predict in multi-thread
  for (int i = 0; i < threadNumber_; ++i) {
    size_t start_idx = getStart(row_len, threadNumber_, i);
    size_t end_idx = getEnd(row_len, threadNumber_, i);
    pool_->enqueue(std::bind(pred_thread,
                             matrix,
                             &model,
                             &pred,
                             score_func_,
                             norm_,
                             start_idx,
                             end_idx));
  }
  // Wait all of the threads finish their job
  pool_->Sync(threadNumber_);
}